

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combination.c
# Opt level: O3

Aig_Man_t * generateGeneralDisjunctiveTester(Abc_Ntk_t *pNtk,Aig_Man_t *pAig,int combK)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  Aig_Man_t *p;
  size_t sVar4;
  char *__s;
  Aig_Obj_t *pAVar5;
  ulong uVar6;
  ulong uVar7;
  uint *__ptr;
  long lVar8;
  void *pvVar9;
  Vec_Ptr_t *pVVar10;
  void **ppvVar11;
  uint *__ptr_00;
  Aig_Obj_t *p1;
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  bool bVar20;
  ulong local_68;
  
  iVar18 = pAig->nRegs;
  p = Aig_ManStart(pAig->vObjs->nSize);
  sVar4 = strlen(pAig->pName);
  __s = (char *)malloc(sVar4 + 5);
  p->pName = __s;
  iVar14 = 0;
  sprintf(__s,"%s_%s",pAig->pName,"nCk");
  p->pSpec = (char *)0x0;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  if (0 < pAig->nTruePis) {
    lVar12 = 0;
    do {
      if (pAig->vCis->nSize <= lVar12) goto LAB_005bbd82;
      pvVar9 = pAig->vCis->pArray[lVar12];
      pAVar5 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar9 + 0x28) = pAVar5;
      lVar12 = lVar12 + 1;
    } while (lVar12 < pAig->nTruePis);
  }
  if (0 < pAig->nRegs) {
    iVar14 = 0;
    do {
      uVar3 = pAig->nTruePis + iVar14;
      if (((int)uVar3 < 0) || (pAig->vCis->nSize <= (int)uVar3)) goto LAB_005bbd82;
      pvVar9 = pAig->vCis->pArray[uVar3];
      iVar14 = iVar14 + 1;
      pAVar5 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar9 + 0x28) = pAVar5;
    } while (iVar14 < pAig->nRegs);
  }
  if (0 < combK) {
    uVar19 = 1;
    uVar7 = 0;
    do {
      uVar6 = uVar7;
      lVar12 = countCombination((long)iVar18,uVar19);
      uVar7 = lVar12 + uVar6;
      uVar19 = uVar19 + 1;
    } while (combK + 1 != uVar19);
    if (0 < (long)uVar7) {
      __ptr = (uint *)malloc(0x10);
      iVar2 = (int)uVar7;
      local_68 = 8;
      if (6 < iVar2 - 1U) {
        local_68 = uVar7 & 0xffffffff;
      }
      __ptr[1] = 0;
      iVar15 = (int)local_68;
      lVar8 = (long)iVar15;
      if (iVar15 == 0) {
        pvVar9 = (void *)0x0;
      }
      else {
        pvVar9 = malloc(lVar8 * 8);
      }
      *(void **)(__ptr + 2) = pvVar9;
      lVar12 = lVar12 + uVar6;
      uVar7 = local_68;
      lVar13 = 0;
      do {
        pAVar5 = Aig_ObjCreateCi(p);
        iVar16 = (int)uVar7;
        if ((int)lVar13 == iVar16) {
          if (iVar16 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar9 = malloc(0x80);
            }
            else {
              pvVar9 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar9;
            *__ptr = 0x10;
            uVar7 = 0x10;
          }
          else {
            uVar7 = (ulong)(uint)(iVar16 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar9 = malloc(uVar7 * 8);
            }
            else {
              pvVar9 = realloc(*(void **)(__ptr + 2),uVar7 * 8);
            }
            *(void **)(__ptr + 2) = pvVar9;
            *__ptr = iVar16 * 2;
          }
        }
        else {
          pvVar9 = *(void **)(__ptr + 2);
        }
        lVar1 = lVar13 + 1;
        __ptr[1] = (int)lVar13 + 1;
        *(Aig_Obj_t **)((long)pvVar9 + lVar13 * 8) = pAVar5;
        lVar13 = lVar1;
      } while (lVar12 != lVar1);
      pVVar10 = pAig->vObjs;
      if (0 < pVVar10->nSize) {
        lVar13 = 0;
        do {
          pvVar9 = pVVar10->pArray[lVar13];
          if ((pvVar9 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar9 + 0x18) & 7) - 7)) {
            if (((ulong)pvVar9 & 1) != 0) goto LAB_005bbda1;
            uVar7 = *(ulong *)((long)pvVar9 + 8) & 0xfffffffffffffffe;
            if (uVar7 == 0) {
              pAVar5 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar5 = (Aig_Obj_t *)
                       ((ulong)((uint)*(ulong *)((long)pvVar9 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28));
            }
            uVar7 = *(ulong *)((long)pvVar9 + 0x10) & 0xfffffffffffffffe;
            if (uVar7 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar9 + 0x10) & 1) ^ *(ulong *)(uVar7 + 0x28));
            }
            pAVar5 = Aig_And(p,pAVar5,p1);
            *(Aig_Obj_t **)((long)pvVar9 + 0x28) = pAVar5;
            pVVar10 = pAig->vObjs;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < pVVar10->nSize);
      }
      pVVar10 = (Vec_Ptr_t *)malloc(0x10);
      pVVar10->nSize = 0;
      pVVar10->nCap = iVar15;
      if (iVar15 == 0) {
        ppvVar11 = (void **)0x0;
      }
      else {
        ppvVar11 = (void **)malloc(lVar8 * 8);
      }
      pVVar10->pArray = ppvVar11;
      if (0 < combK) {
        iVar16 = 1;
        do {
          generateCombinatorialStabilExhaust(p,pAig,pVVar10,iVar18,iVar16);
          bVar20 = iVar16 != combK;
          iVar16 = iVar16 + 1;
        } while (bVar20);
      }
      __ptr_00 = (uint *)malloc(0x10);
      __ptr_00[1] = 0;
      if (iVar15 == 0) {
        pvVar9 = (void *)0x0;
      }
      else {
        pvVar9 = malloc(lVar8 << 3);
      }
      *(void **)(__ptr_00 + 2) = pvVar9;
      lVar8 = 0;
      do {
        if (((lVar8 == 0x80000000) || (uVar3 = (uint)lVar8, (int)lVar1 + -1 < (int)uVar3)) ||
           (pVVar10->nSize <= (int)uVar3)) goto LAB_005bbd82;
        pAVar5 = Aig_Or(p,(Aig_Obj_t *)((ulong)pVVar10->pArray[uVar3 & 0x7fffffff] ^ 1),
                        *(Aig_Obj_t **)(*(long *)(__ptr + 2) + (ulong)(uVar3 & 0x7fffffff) * 8));
        uVar17 = (uint)local_68;
        if (uVar3 == uVar17) {
          if ((int)uVar17 < 0x10) {
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar9 = malloc(0x80);
            }
            else {
              pvVar9 = realloc(*(void **)(__ptr_00 + 2),0x80);
            }
            *(void **)(__ptr_00 + 2) = pvVar9;
            *__ptr_00 = 0x10;
            local_68 = 0x10;
          }
          else {
            local_68 = (ulong)(uVar17 * 2);
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar9 = malloc(local_68 * 8);
            }
            else {
              pvVar9 = realloc(*(void **)(__ptr_00 + 2),local_68 * 8);
            }
            *(void **)(__ptr_00 + 2) = pvVar9;
            *__ptr_00 = uVar17 * 2;
          }
        }
        else {
          pvVar9 = *(void **)(__ptr_00 + 2);
        }
        lVar13 = lVar8 + 1;
        __ptr_00[1] = (uint)lVar13;
        *(Aig_Obj_t **)((long)pvVar9 + lVar8 * 8) = pAVar5;
        lVar8 = lVar13;
      } while (lVar12 != lVar13);
      if (0 < pAig->nTruePos) {
        lVar8 = 0;
        do {
          if (pAig->vCos->nSize <= lVar8) goto LAB_005bbd82;
          pvVar9 = pAig->vCos->pArray[lVar8];
          if (((ulong)pvVar9 & 1) != 0) goto LAB_005bbda1;
          uVar7 = *(ulong *)((long)pvVar9 + 8) & 0xfffffffffffffffe;
          if (uVar7 == 0) {
            pAVar5 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar5 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar9 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28));
          }
          pAVar5 = Aig_ObjCreateCo(p,pAVar5);
          *(Aig_Obj_t **)((long)pvVar9 + 0x28) = pAVar5;
          lVar8 = lVar8 + 1;
        } while (lVar8 < pAig->nTruePos);
      }
      iVar18 = (uint)lVar13 - 1;
      lVar8 = 0;
      do {
        if ((lVar8 == 0x80000000) || (iVar18 < (int)(uint)lVar8)) goto LAB_005bbd82;
        Aig_ObjCreateCo(p,*(Aig_Obj_t **)
                           (*(long *)(__ptr_00 + 2) + (ulong)((uint)lVar8 & 0x7fffffff) * 8));
        lVar8 = lVar8 + 1;
      } while (lVar12 != lVar8);
      if (pAig->nRegs < 1) {
        iVar15 = 0;
      }
      else {
        iVar15 = 0;
        do {
          uVar3 = pAig->nTruePos + iVar15;
          if (((int)uVar3 < 0) || (pAig->vCos->nSize <= (int)uVar3)) goto LAB_005bbd82;
          pvVar9 = pAig->vCos->pArray[uVar3];
          if (((ulong)pvVar9 & 1) != 0) {
LAB_005bbda1:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                          ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
          }
          uVar7 = *(ulong *)((long)pvVar9 + 8);
          uVar19 = uVar7 & 0xfffffffffffffffe;
          if (uVar19 == 0) {
            pAVar5 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar5 = (Aig_Obj_t *)((ulong)((uint)uVar7 & 1) ^ *(ulong *)(uVar19 + 0x28));
          }
          iVar15 = iVar15 + 1;
          Aig_ObjCreateCo(p,pAVar5);
        } while (iVar15 < pAig->nRegs);
      }
      lVar8 = 0;
      while ((lVar8 != 0x80000000 && (uVar3 = (uint)lVar8, (int)uVar3 <= iVar18))) {
        lVar8 = lVar8 + 1;
        Aig_ObjCreateCo(p,*(Aig_Obj_t **)(*(long *)(__ptr_00 + 2) + (ulong)(uVar3 & 0x7fffffff) * 8)
                       );
        if (lVar12 == lVar8) {
          if (iVar15 + iVar2 != iVar14 + iVar2) {
            __assert_fail("liCopied + liCreated == loCopied + loCreated",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/combination.c"
                          ,0x1c1,
                          "Aig_Man_t *generateGeneralDisjunctiveTester(Abc_Ntk_t *, Aig_Man_t *, int)"
                         );
          }
          Aig_ManSetRegNum(p,iVar15 + iVar2);
          Aig_ManCleanup(p);
          iVar18 = Aig_ManCheck(p);
          if (iVar18 == 0) {
            __assert_fail("Aig_ManCheck( pNewAig )",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/combination.c"
                          ,0x1c6,
                          "Aig_Man_t *generateGeneralDisjunctiveTester(Abc_Ntk_t *, Aig_Man_t *, int)"
                         );
          }
          if (*(void **)(__ptr + 2) != (void *)0x0) {
            free(*(void **)(__ptr + 2));
          }
          free(__ptr);
          if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
            free(*(void **)(__ptr_00 + 2));
          }
          free(__ptr_00);
          if (pVVar10->pArray != (void **)0x0) {
            free(pVVar10->pArray);
          }
          free(pVVar10);
          return p;
        }
      }
LAB_005bbd82:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
  }
  __assert_fail("lCombinationCount > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/combination.c"
                ,0x181,"Aig_Man_t *generateGeneralDisjunctiveTester(Abc_Ntk_t *, Aig_Man_t *, int)")
  ;
}

Assistant:

Aig_Man_t *generateGeneralDisjunctiveTester( Abc_Ntk_t *pNtk, Aig_Man_t *pAig, int combK )
{
	//AIG creation related data structure
	Aig_Man_t *pNewAig;
	int piCopied = 0, loCopied = 0, loCreated = 0, liCopied = 0, liCreated = 0, poCopied = 0;
	//int i, iElem, nRegCount, hintSingalBeginningMarker, hintSingalEndMarker;
	int i, nRegCount;
	int combN_internal, combK_internal; //, targetPoIndex;
	long longI, lCombinationCount;
	//Aig_Obj_t *pObj, *pObjMonoCand, *pObjLO_nCk, *pObjDisj_nCk;
	Aig_Obj_t *pObj, *pObjLO_nCk, *pObjDisj_nCk;
	Vec_Ptr_t *vLO_nCk, *vPODriver_nCk, *vDisj_nCk;

	extern Vec_Int_t *findHintOutputs(Abc_Ntk_t *pNtk);
	
	//Knuth's Data Strcuture
	//Vec_Int_t *vC_KNUTH;
	//int i_KNUTH, j_KNUTH, combCounter_KNUTH = 0;

	//Collecting target HINT signals
	//vCandidateMonotoneSignals = findHintOutputs(pNtk);
	//if( vCandidateMonotoneSignals == NULL )
	//{
	//	printf("\nTraget Signal Set is Empty: Duplicating given AIG\n");
	//	combN_internal = 0;
	//}
	//else
	//{
		//Vec_IntForEachEntry( vCandidateMonotoneSignals, iElem, i )
		//	printf("Po[%d] = %s\n", iElem, Abc_ObjName( Abc_NtkPo(pNtk, iElem) ) );
	//	hintSingalBeginningMarker = Vec_IntEntry( vCandidateMonotoneSignals, 0 );
	//	hintSingalEndMarker = Vec_IntEntry( vCandidateMonotoneSignals, Vec_IntSize(vCandidateMonotoneSignals) - 1 );
	//	combN_internal = hintSingalEndMarker - hintSingalBeginningMarker + 1;
	//}

	combN_internal = Aig_ManRegNum(pAig);

	pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
	pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_nCk") + 1 );
	sprintf(pNewAig->pName, "%s_%s", pAig->pName, "nCk");
    	pNewAig->pSpec = NULL;

	//Standard Mapping of Constant Nodes
	pObj = Aig_ManConst1( pAig );
    	pObj->pData = Aig_ManConst1( pNewAig );

	//Standard AIG PI duplication
	Saig_ManForEachPi( pAig, pObj, i )
	{
		piCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
	}

	//Standard AIG LO duplication
	Saig_ManForEachLo( pAig, pObj, i )
    	{
		loCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
    	}

	//nCk LO creation
	lCombinationCount = 0;
	for(combK_internal=1; combK_internal<=combK; combK_internal++)
		lCombinationCount += countCombination( combN_internal, combK_internal );
	assert( lCombinationCount > 0 );
	vLO_nCk = Vec_PtrAlloc(lCombinationCount);
	for( longI = 0; longI < lCombinationCount; longI++ )
	{
		loCreated++;
		pObj = Aig_ObjCreateCi(pNewAig);
		Vec_PtrPush( vLO_nCk, pObj );
	}

	//Standard Node duplication
	Aig_ManForEachNode( pAig, pObj, i )
	{
		pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}
	
	//nCk specific logic creation (i.e. nCk number of OR gates)
	vDisj_nCk = Vec_PtrAlloc(lCombinationCount);

	for( combK_internal=1; combK_internal<=combK; combK_internal++ )
	{
		generateCombinatorialStabilExhaust( pNewAig, pAig,
				vDisj_nCk, combN_internal, combK_internal );
	}


	//creation of implication logic
	vPODriver_nCk = Vec_PtrAlloc(lCombinationCount);
	for( longI = 0; longI < lCombinationCount; longI++ )
	{
		pObjLO_nCk = (Aig_Obj_t *)(Vec_PtrEntry( vLO_nCk, longI ));
		pObjDisj_nCk = (Aig_Obj_t *)(Vec_PtrEntry( vDisj_nCk, longI ));

		pObj = Aig_Or( pNewAig, Aig_Not(pObjDisj_nCk), pObjLO_nCk);
		Vec_PtrPush(vPODriver_nCk, pObj);
	}
	
	//Standard PO duplication
	Saig_ManForEachPo( pAig, pObj, i )
	{
		poCopied++;
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
	}

	//nCk specific PO creation
	for( longI = 0; longI < lCombinationCount; longI++ )
	{
		Aig_ObjCreateCo( pNewAig, (Aig_Obj_t *)(Vec_PtrEntry( vPODriver_nCk, longI )) );
	}

	//Standard LI duplication
	Saig_ManForEachLi( pAig, pObj, i )
	{
		liCopied++;
		Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
	}

	//nCk specific LI creation
	for( longI = 0; longI < lCombinationCount; longI++ )
	{
		liCreated++;
		Aig_ObjCreateCo( pNewAig, (Aig_Obj_t *)(Vec_PtrEntry( vPODriver_nCk, longI )) );
	}

	//clean-up, book-keeping
	assert( liCopied + liCreated == loCopied + loCreated );	
	nRegCount = loCopied + loCreated;

	Aig_ManSetRegNum( pNewAig, nRegCount );
	Aig_ManCleanup( pNewAig );
	assert( Aig_ManCheck( pNewAig ) );
	
	Vec_PtrFree(vLO_nCk);
	Vec_PtrFree(vPODriver_nCk);
	Vec_PtrFree(vDisj_nCk);
	//Vec_IntFree(vC_KNUTH);	
	return pNewAig;
}